

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

void update_smooth_effects(DUMB_IT_SIGRENDERER *sigrenderer)

{
  IT_PLAYING *playing;
  long lVar1;
  
  lVar1 = 0xa8;
  do {
    playing = *(IT_PLAYING **)(sigrenderer->channel[0].arpeggio_offsets + lVar1 + -0x50);
    if (playing != (IT_PLAYING *)0x0) {
      update_smooth_effects_playing(playing);
    }
    lVar1 = lVar1 + 0xa0;
  } while (lVar1 != 0x28a8);
  lVar1 = 0;
  do {
    if (sigrenderer->playing[lVar1] != (IT_PLAYING *)0x0) {
      update_smooth_effects_playing(sigrenderer->playing[lVar1]);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xc0);
  return;
}

Assistant:

static void update_smooth_effects(DUMB_IT_SIGRENDERER *sigrenderer)
{
	int i;

	for (i = 0; i < DUMB_IT_N_CHANNELS; i++) {
		IT_CHANNEL *channel = &sigrenderer->channel[i];
		IT_PLAYING *playing = channel->playing;

		if (playing) {
			update_smooth_effects_playing(playing);
		}
	}

	for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
		IT_PLAYING *playing = sigrenderer->playing[i];

		if (playing) {
			update_smooth_effects_playing(playing);
		}
	}
}